

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

void __thiscall
duckdb::BindContext::GenerateAllColumnExpressions
          (BindContext *this,StarExpression *expr,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *new_select_list)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pBVar3;
  pointer ppVar4;
  element_type *peVar5;
  StarExpression *pSVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  string *psVar10;
  type pPVar11;
  iterator iVar12;
  type pBVar13;
  __node_base_ptr p_Var14;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var15;
  OperatorExpression *this_00;
  pointer pOVar16;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var17;
  type pOVar18;
  column_t __n;
  reference other;
  child_list_t<LogicalType> *pcVar19;
  reference pvVar20;
  UsingColumnSet *this_01;
  type pCVar21;
  type pBVar22;
  iterator iVar23;
  BinderException *pBVar24;
  iterator iVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  char *pcVar26;
  pointer pbVar27;
  BindingAlias *pBVar28;
  pointer ppVar29;
  __node_base *p_Var30;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *this_02;
  __hash_code __code;
  __node_base *p_Var31;
  optional_ptr<duckdb::Binding,_true> binding;
  value_type col_type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  ErrorData error;
  QualifiedColumnName qualified_name;
  ExclusionListInfo exclusion_info;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_338;
  undefined1 local_330 [32];
  StarExpression *local_310;
  LogicalType local_308;
  BindContext *local_2f0;
  BindingAlias *local_2e8;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  *local_2e0;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> local_2d8;
  _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  undefined1 local_2b0 [80];
  undefined1 local_260 [16];
  _Alloc_hider local_250;
  char local_240 [16];
  undefined1 local_230 [32];
  float local_210;
  undefined4 uStack_20c;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_200;
  _Alloc_hider local_1f0;
  char local_1e0 [16];
  _Alloc_hider local_1d0;
  char local_1c0 [16];
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *local_1b0;
  unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *local_1a8;
  UsingColumnSet *local_1a0;
  string *local_198;
  pointer local_190;
  string local_188;
  string local_168;
  string local_148;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ExclusionListInfo local_e8;
  string local_70;
  string local_50;
  
  this_02 = (this->bindings_list).
            super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1b0 = (this->bindings_list).
              super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_2f0 = this;
  if (this_02 == local_1b0) {
    pBVar24 = (BinderException *)__cxa_allocate_exception(0x10);
    local_2b0._0_8_ = local_2b0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2b0,"* expression without FROM clause!","");
    BinderException::BinderException(pBVar24,(string *)local_2b0);
    __cxa_throw(pBVar24,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_e8.excluded_columns._M_h._M_buckets = &local_e8.excluded_columns._M_h._M_single_bucket;
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
  local_e8.excluded_columns._M_h._M_bucket_count = 1;
  local_e8.excluded_columns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e8.excluded_columns._M_h._M_element_count = 0;
  local_e8.excluded_columns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_e8.excluded_columns._M_h._M_rehash_policy._M_next_resize = 0;
  local_e8.excluded_columns._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e8.excluded_qualified_columns._M_h._M_buckets =
       &local_e8.excluded_qualified_columns._M_h._M_single_bucket;
  local_e8.excluded_qualified_columns._M_h._M_bucket_count = 1;
  local_e8.excluded_qualified_columns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e8.excluded_qualified_columns._M_h._M_element_count = 0;
  local_e8.excluded_qualified_columns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_e8.excluded_qualified_columns._M_h._M_rehash_policy._M_next_resize = 0;
  local_e8.excluded_qualified_columns._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_310 = expr;
  local_2e0 = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
               *)new_select_list;
  local_e8.new_select_list = new_select_list;
  if ((expr->relation_name)._M_string_length == 0) {
    local_230._0_8_ = &aStack_200;
    local_230._8_8_ = 1;
    local_230._16_8_ = 0;
    local_230._24_8_ = 0;
    local_210 = 1.0;
    local_208 = 0;
    aStack_200._M_allocated_capacity = 0;
    local_2d0 = &(expr->rename_list)._M_h;
    do {
      local_1a8 = this_02;
      pBVar13 = unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>::operator*
                          (this_02);
      pbVar27 = (pBVar13->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_190 = (pBVar13->names).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar27 != local_190) {
        local_2e8 = &pBVar13->alias;
        local_198 = &(pBVar13->alias).schema;
        do {
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          pcVar2 = (pbVar27->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,pcVar2,pcVar2 + pbVar27->_M_string_length);
          QualifiedColumnName::QualifiedColumnName
                    ((QualifiedColumnName *)local_2b0,local_2e8,&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p);
          }
          bVar9 = CheckExclusionList(local_310,(QualifiedColumnName *)local_2b0,&local_e8);
          pBVar28 = local_2e8;
          if (!bVar9) {
            local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)GetUsingBinding(local_2f0,pbVar27,local_2e8);
            if ((UsingColumnSet *)
                local_2c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == (UsingColumnSet *)0x0) {
              psVar10 = BindingAlias::GetAlias_abi_cxx11_(pBVar28);
              CreateColumnReference
                        ((BindContext *)local_330,(string *)local_2f0,&pBVar28->catalog,local_198,
                         psVar10,(ColumnBindType)pbVar27);
              pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)local_330);
              iVar12 = ::std::
                       _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(local_2d0,(key_type *)local_2b0);
              if (iVar12.
                  super__Node_iterator_base<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur != (__node_type *)0x0) {
                ::std::__cxx11::string::_M_assign((string *)&(pPVar11->super_BaseExpression).alias);
              }
              ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                        (local_2e0,
                         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)local_330);
              if ((UsingColumnSet *)local_330._0_8_ != (UsingColumnSet *)0x0) {
                (**(code **)((((BindingAlias *)local_330._0_8_)->catalog)._M_dataplus._M_p + 8))();
              }
            }
            else {
              optional_ptr<duckdb::UsingColumnSet,_true>::CheckValid
                        ((optional_ptr<duckdb::UsingColumnSet,_true> *)&local_2c8);
              _Var17._M_head_impl =
                   (ParsedExpression *)
                   local_2c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_330._0_8_ =
                   local_2c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              p_Var14 = ::std::
                        _Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,_std::reference_wrapper<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::_M_find_before_node
                                  ((_Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,_std::reference_wrapper<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                    *)local_230,
                                   (ulong)local_2c8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start %
                                   (ulong)local_230._8_8_,(key_type *)local_330,
                                   (__hash_code)
                                   local_2c8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
              if ((p_Var14 == (__node_base_ptr)0x0) || (p_Var14->_M_nxt == (_Hash_node_base *)0x0))
              {
                if (*(size_type *)((long)_Var17._M_head_impl + 0x48) == 0) {
                  this_00 = (OperatorExpression *)operator_new(0x50);
                  local_330._0_8_ =
                       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                        )0x0;
                  local_308._0_8_ = (ParsedExpression *)0x0;
                  OperatorExpression::OperatorExpression
                            (this_00,OPERATOR_COALESCE,
                             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)local_330,
                             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)&local_308);
                  local_338._M_head_impl = (ParsedExpression *)this_00;
                  if ((ParsedExpression *)local_308._0_8_ != (ParsedExpression *)0x0) {
                    (**(code **)(*(long *)local_308._0_8_ + 8))();
                  }
                  local_308._0_8_ = (ParsedExpression *)0x0;
                  if ((ParsedExpression *)local_330._0_8_ != (ParsedExpression *)0x0) {
                    (*(code *)((__node_base_ptr)
                              (((BindingAlias *)local_330._0_8_)->catalog)._M_dataplus._M_p)[1].
                              _M_nxt)();
                  }
                  pBVar28 = *(BindingAlias **)
                             &(((vector<duckdb::BindingAlias,_true> *)
                               ((long)_Var17._M_head_impl + 0x60))->
                              super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>
                              ).
                              super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>
                              ._M_impl;
                  local_1a0 = (UsingColumnSet *)_Var17._M_head_impl;
                  pBVar3 = *(pointer *)((long)_Var17._M_head_impl + 0x68);
                  for (; pBVar28 != pBVar3; pBVar28 = pBVar28 + 1) {
                    pOVar16 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                              ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                                            *)&local_338);
                    _Var17._M_head_impl = (ParsedExpression *)operator_new(0x50);
                    local_330._0_8_ = (long)local_330 + 0x10;
                    pcVar2 = (pbVar27->_M_dataplus)._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)local_330,pcVar2,pcVar2 + pbVar27->_M_string_length);
                    ColumnRefExpression::ColumnRefExpression
                              ((ColumnRefExpression *)_Var17._M_head_impl,(string *)local_330,
                               pBVar28);
                    if (local_330._0_8_ != (long)local_330 + 0x10) {
                      operator_delete((void *)local_330._0_8_);
                    }
                    local_308._0_8_ = _Var17._M_head_impl;
                    ::std::
                    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    ::
                    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                                *)&pOVar16->children,
                               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                *)&local_308);
                    if ((ParsedExpression *)local_308._0_8_ != (ParsedExpression *)0x0) {
                      (*(*(_func_int ***)local_308._0_8_)[1])();
                    }
                  }
                  pOVar16 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                            ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                                          *)&local_338);
                  ::std::__cxx11::string::_M_assign
                            ((string *)&(pOVar16->super_ParsedExpression).super_BaseExpression.alias
                            );
                  pOVar18 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                            ::operator*((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                                         *)&local_338);
                  iVar12 = ::std::
                           _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           ::find(local_2d0,(key_type *)local_2b0);
                  if (iVar12.
                      super__Node_iterator_base<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur != (__node_type *)0x0) {
                    ::std::__cxx11::string::_M_assign
                              ((string *)
                               &(pOVar18->super_ParsedExpression).super_BaseExpression.alias);
                  }
                  local_330._0_8_ = local_338._M_head_impl;
                  local_338._M_head_impl = (ParsedExpression *)0x0;
                  ::std::
                  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  ::
                  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                            (local_2e0,
                             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)local_330);
                  _Var17._M_head_impl = (ParsedExpression *)local_1a0;
                  _Var15._M_head_impl = local_338._M_head_impl;
                  if ((UsingColumnSet *)local_330._0_8_ != (UsingColumnSet *)0x0) {
                    (*((BaseExpression *)&((BindingAlias *)local_330._0_8_)->catalog)->
                      _vptr_BaseExpression[1])();
                    _Var15._M_head_impl = local_338._M_head_impl;
                  }
                }
                else {
                  _Var15._M_head_impl = (ParsedExpression *)operator_new(0x50);
                  local_330._0_8_ = (long)local_330 + 0x10;
                  pcVar2 = (pbVar27->_M_dataplus)._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_330,pcVar2,pcVar2 + pbVar27->_M_string_length);
                  ColumnRefExpression::ColumnRefExpression
                            ((ColumnRefExpression *)_Var15._M_head_impl,(string *)local_330,
                             (BindingAlias *)_Var17._M_head_impl);
                  local_308._0_8_ = _Var15._M_head_impl;
                  if ((UsingColumnSet *)local_330._0_8_ != (UsingColumnSet *)(local_330 + 0x10)) {
                    operator_delete((void *)local_330._0_8_);
                  }
                  pCVar21 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                            ::operator*((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                                         *)&local_308);
                  iVar12 = ::std::
                           _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           ::find(local_2d0,(key_type *)local_2b0);
                  if (iVar12.
                      super__Node_iterator_base<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur != (__node_type *)0x0) {
                    ::std::__cxx11::string::_M_assign
                              ((string *)
                               &(pCVar21->super_ParsedExpression).super_BaseExpression.alias);
                  }
                  uVar7 = local_308._0_8_;
                  local_308._0_8_ = (ParsedExpression *)0x0;
                  uVar8 = local_308._0_8_;
                  local_308.id_ = (LogicalTypeId)uVar7;
                  local_308.physical_type_ = SUB81(uVar7,1);
                  local_308._2_6_ = SUB86(uVar7,2);
                  local_330[0] = local_308.id_;
                  local_330[1] = local_308.physical_type_;
                  local_330._2_6_ = local_308._2_6_;
                  local_308._0_8_ = uVar8;
                  ::std::
                  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  ::
                  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                            (local_2e0,
                             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)local_330);
                  _Var15._M_head_impl = (ParsedExpression *)local_308._0_8_;
                  if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                       )local_330._0_8_ != (ParsedExpression *)0x0) {
                    (*((BaseExpression *)&((BindingAlias *)local_330._0_8_)->catalog)->
                      _vptr_BaseExpression[1])();
                    _Var15._M_head_impl = (ParsedExpression *)local_308._0_8_;
                  }
                }
                if ((Binding *)_Var15._M_head_impl != (Binding *)0x0) {
                  (*((_Var15._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                }
                local_330._0_8_ = local_230;
                local_308._0_8_ = _Var17._M_head_impl;
                ::std::
                _Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,std::reference_wrapper<duckdb::UsingColumnSet>,std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::UsingColumnSet>,duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::
                _M_insert<std::reference_wrapper<duckdb::UsingColumnSet>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::reference_wrapper<duckdb::UsingColumnSet>,true>>>>
                          ((_Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,std::reference_wrapper<duckdb::UsingColumnSet>,std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::UsingColumnSet>,duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)local_330._0_8_,
                           (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                            *)&local_308,local_330);
              }
            }
          }
          if (local_250._M_p != local_240) {
            operator_delete(local_250._M_p);
          }
          if ((undefined1 *)local_2b0._64_8_ != local_260) {
            operator_delete((void *)local_2b0._64_8_);
          }
          if ((undefined1 *)local_2b0._32_8_ != local_2b0 + 0x30) {
            operator_delete((void *)local_2b0._32_8_);
          }
          if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
            operator_delete((void *)local_2b0._0_8_);
          }
          pbVar27 = pbVar27 + 1;
        } while (pbVar27 != local_190);
      }
      this_02 = local_1a8 + 1;
    } while (this_02 != local_1b0);
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,_std::reference_wrapper<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::reference_wrapper<duckdb::UsingColumnSet>,_std::reference_wrapper<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_230);
  }
  else {
    ErrorData::ErrorData((ErrorData *)local_2b0);
    psVar10 = &expr->relation_name;
    local_338._M_head_impl =
         (ParsedExpression *)GetBinding(local_2f0,psVar10,(ErrorData *)local_2b0);
    if ((Binding *)local_338._M_head_impl == (Binding *)0x0) {
      local_338._M_head_impl = (ParsedExpression *)GetMatchingBinding(local_2f0,psVar10);
      if ((Binding *)local_338._M_head_impl == (Binding *)0x0) {
        local_230._0_8_ = local_230 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,anon_var_dwarf_4ed193b + 9);
        ErrorData::Throw((ErrorData *)local_2b0,(string *)local_230);
      }
      optional_ptr<duckdb::Binding,_true>::CheckValid
                ((optional_ptr<duckdb::Binding,_true> *)&local_338);
      __n = Binding::GetBindingIndex((Binding *)local_338._M_head_impl,psVar10);
      optional_ptr<duckdb::Binding,_true>::CheckValid
                ((optional_ptr<duckdb::Binding,_true> *)&local_338);
      other = vector<duckdb::LogicalType,_true>::operator[]
                        ((vector<duckdb::LogicalType,_true> *)
                         ((long)(local_338._M_head_impl + 2) + 8),__n);
      LogicalType::LogicalType(&local_308,other);
      if (local_308.id_ != STRUCT) {
        pBVar24 = (BinderException *)__cxa_allocate_exception(0x10);
        local_128[0] = local_118;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_128,
                   "Cannot extract field from expression \"%s\" because it is not a struct","");
        (*(expr->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[8])
                  (&local_50,expr);
        StringUtil::Format<std::__cxx11::string>
                  ((string *)local_230,(StringUtil *)local_128,&local_50,params);
        BinderException::BinderException(pBVar24,(string *)local_230);
        __cxa_throw(pBVar24,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pcVar19 = StructType::GetChildTypes_abi_cxx11_(&local_308);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2c8,3,(allocator_type *)local_230);
      optional_ptr<duckdb::Binding,_true>::CheckValid
                ((optional_ptr<duckdb::Binding,_true> *)&local_338);
      BindingAlias::GetAlias_abi_cxx11_
                ((BindingAlias *)&((local_338._M_head_impl)->super_BaseExpression).alias);
      pvVar20 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)&local_2c8,0);
      ::std::__cxx11::string::_M_assign((string *)pvVar20);
      pvVar20 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)&local_2c8,1);
      ::std::__cxx11::string::_M_assign((string *)pvVar20);
      ppVar29 = (pcVar19->
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (pcVar19->
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar29 != ppVar4) {
        local_2e8 = (BindingAlias *)&local_310->rename_list;
        do {
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          pcVar2 = (ppVar29->first)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_188,pcVar2,pcVar2 + (ppVar29->first)._M_string_length);
          QualifiedColumnName::QualifiedColumnName((QualifiedColumnName *)local_230,&local_188);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
          bVar9 = CheckExclusionList(local_310,(QualifiedColumnName *)local_230,&local_e8);
          if (!bVar9) {
            pvVar20 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    *)&local_2c8,2);
            ::std::__cxx11::string::_M_assign((string *)pvVar20);
            this_01 = (UsingColumnSet *)operator_new(0x50);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_330,&local_2c8);
            ColumnRefExpression::ColumnRefExpression
                      ((ColumnRefExpression *)this_01,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)local_330);
            local_2d8._M_head_impl = (ColumnRefExpression *)this_01;
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_330);
            pCVar21 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                      ::operator*((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                                   *)&local_2d8);
            iVar12 = ::std::
                     _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_2e8,(QualifiedColumnName *)local_230);
            if (iVar12.
                super__Node_iterator_base<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              ::std::__cxx11::string::_M_assign
                        ((string *)&(pCVar21->super_ParsedExpression).super_BaseExpression.alias);
            }
            local_330._0_8_ = local_2d8._M_head_impl;
            local_2d8._M_head_impl = (ColumnRefExpression *)0x0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      (local_2e0,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)local_330);
            if ((UsingColumnSet *)local_330._0_8_ != (UsingColumnSet *)0x0) {
              (**(code **)((((BindingAlias *)local_330._0_8_)->catalog)._M_dataplus._M_p + 8))();
            }
            if (local_2d8._M_head_impl != (ColumnRefExpression *)0x0) {
              (*(code *)((__node_base_ptr)
                        ((local_2d8._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                        _vptr_BaseExpression)[1]._M_nxt)();
            }
          }
          if (local_1d0._M_p != local_1c0) {
            operator_delete(local_1d0._M_p);
          }
          if (local_1f0._M_p != local_1e0) {
            operator_delete(local_1f0._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_20c,local_210) != &aStack_200) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_20c,local_210));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_230 + 0x10)) {
            operator_delete((void *)local_230._0_8_);
          }
          ppVar29 = ppVar29 + 1;
        } while (ppVar29 != ppVar4);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2c8);
      LogicalType::~LogicalType(&local_308);
    }
    else {
      optional_ptr<duckdb::Binding,_true>::CheckValid
                ((optional_ptr<duckdb::Binding,_true> *)&local_338);
      pbVar27 = *(pointer *)
                 &(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     *)((long)(local_338._M_head_impl + 2) + 0x20))->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl;
      pbVar1 = *(pointer *)((long)(local_338._M_head_impl + 2) + 0x28);
      if (pbVar27 != pbVar1) {
        local_2e8 = (BindingAlias *)&local_310->rename_list;
        do {
          optional_ptr<duckdb::Binding,_true>::CheckValid
                    ((optional_ptr<duckdb::Binding,_true> *)&local_338);
          _Var17._M_head_impl = local_338._M_head_impl;
          pcVar2 = (pbVar27->_M_dataplus)._M_p;
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,pcVar2,pcVar2 + pbVar27->_M_string_length);
          QualifiedColumnName::QualifiedColumnName
                    ((QualifiedColumnName *)local_230,
                     (BindingAlias *)&((_Var17._M_head_impl)->super_BaseExpression).alias,&local_148
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          bVar9 = CheckExclusionList(local_310,(QualifiedColumnName *)local_230,&local_e8);
          if (!bVar9) {
            optional_ptr<duckdb::Binding,_true>::CheckValid
                      ((optional_ptr<duckdb::Binding,_true> *)&local_338);
            _Var17._M_head_impl = local_338._M_head_impl;
            pBVar28 = (BindingAlias *)&((local_338._M_head_impl)->super_BaseExpression).alias;
            psVar10 = BindingAlias::GetAlias_abi_cxx11_(pBVar28);
            CreateColumnReference
                      ((BindContext *)local_330,(string *)local_2f0,(string *)pBVar28,
                       (string *)&((_Var17._M_head_impl)->super_BaseExpression).query_location,
                       psVar10,(ColumnBindType)pbVar27);
            pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)local_330);
            iVar12 = ::std::
                     _Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<duckdb::QualifiedColumnName,_std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_2e8,(QualifiedColumnName *)local_230);
            if (iVar12.
                super__Node_iterator_base<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              ::std::__cxx11::string::_M_assign((string *)&(pPVar11->super_BaseExpression).alias);
            }
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      (local_2e0,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)local_330);
            if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 )local_330._0_8_ != (ParsedExpression *)0x0) {
              (**(code **)((((BindingAlias *)local_330._0_8_)->catalog)._M_dataplus._M_p + 8))();
            }
          }
          if (local_1d0._M_p != local_1c0) {
            operator_delete(local_1d0._M_p);
          }
          if (local_1f0._M_p != local_1e0) {
            operator_delete(local_1f0._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_20c,local_210) != &aStack_200) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_20c,local_210));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_230 + 0x10)) {
            operator_delete((void *)local_230._0_8_);
          }
          pbVar27 = pbVar27 + 1;
        } while (pbVar27 != pbVar1);
      }
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_2b0 + 0x48));
    if ((undefined1 *)local_2b0._40_8_ != local_2b0 + 0x38) {
      operator_delete((void *)local_2b0._40_8_);
    }
    if ((undefined1 *)local_2b0._8_8_ != local_2b0 + 0x18) {
      operator_delete((void *)local_2b0._8_8_);
    }
  }
  pSVar6 = local_310;
  pBVar22 = local_2f0->binder;
  peVar5 = (pBVar22->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  while (peVar5 != (element_type *)0x0) {
    pBVar22 = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar22->parent);
    peVar5 = (pBVar22->parent).internal.
             super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (pBVar22->mode == EXTRACT_NAMES) {
    ::std::
    _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(pSVar6->exclude_list)._M_h);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(pSVar6->replace_list)._M_h);
  }
  p_Var30 = &(pSVar6->exclude_list)._M_h._M_before_begin;
  do {
    p_Var30 = p_Var30->_M_nxt;
    if (p_Var30 == (__node_base *)0x0) {
      p_Var31 = &(pSVar6->replace_list)._M_h._M_before_begin;
      do {
        p_Var31 = p_Var31->_M_nxt;
        if (p_Var31 == (__node_base *)0x0) {
          ::std::
          _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_e8.excluded_qualified_columns._M_h);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_e8.excluded_columns._M_h);
          return;
        }
        iVar25 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::find(&local_e8.excluded_columns._M_h,(key_type *)(p_Var31 + 1));
      } while (iVar25.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur != (__node_type *)0x0);
      pBVar24 = (BinderException *)__cxa_allocate_exception(0x10);
      local_2b0._0_8_ = local_2b0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b0,"Column \"%s\" in REPLACE list not found in %s","");
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,p_Var31[1]._M_nxt,
                 (long)&(*(_Hash_node_base **)
                          &((_Prime_rehash_policy *)(p_Var31 + 2))->_M_max_load_factor)->_M_nxt +
                 (long)p_Var31[1]._M_nxt);
      if ((pSVar6->relation_name)._M_string_length == 0) {
        pcVar26 = "FROM clause";
      }
      else {
        pcVar26 = (pSVar6->relation_name)._M_dataplus._M_p;
      }
      BinderException::BinderException<std::__cxx11::string,char_const*>
                (pBVar24,(string *)local_2b0,&local_108,pcVar26);
      __cxa_throw(pBVar24,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar23 = ::std::
             _Hashtable<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnName,_std::allocator<duckdb::QualifiedColumnName>,_std::__detail::_Identity,_duckdb::QualifiedColumnEquality,_duckdb::QualifiedColumnHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find(&local_e8.excluded_qualified_columns._M_h,(key_type *)(p_Var30 + 1));
  } while (iVar23.super__Node_iterator_base<duckdb::QualifiedColumnName,_true>._M_cur !=
           (__node_type *)0x0);
  pBVar24 = (BinderException *)__cxa_allocate_exception(0x10);
  local_2b0._0_8_ = local_2b0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b0,"Column \"%s\" in EXCLUDE list not found in %s","");
  QualifiedColumnName::ToString_abi_cxx11_(&local_70,(key_type *)(p_Var30 + 1));
  if ((pSVar6->relation_name)._M_string_length == 0) {
    pcVar26 = "FROM clause";
  }
  else {
    pcVar26 = (pSVar6->relation_name)._M_dataplus._M_p;
  }
  BinderException::BinderException<std::__cxx11::string,char_const*>
            (pBVar24,(string *)local_2b0,&local_70,pcVar26);
  __cxa_throw(pBVar24,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BindContext::GenerateAllColumnExpressions(StarExpression &expr,
                                               vector<unique_ptr<ParsedExpression>> &new_select_list) {
	if (bindings_list.empty()) {
		throw BinderException("* expression without FROM clause!");
	}
	ExclusionListInfo exclusion_info(new_select_list);
	if (expr.relation_name.empty()) {
		// SELECT * case
		// bind all expressions of each table in-order
		reference_set_t<UsingColumnSet> handled_using_columns;
		for (auto &entry : bindings_list) {
			auto &binding = *entry;
			for (auto &column_name : binding.names) {
				QualifiedColumnName qualified_column(binding.alias, column_name);
				if (CheckExclusionList(expr, qualified_column, exclusion_info)) {
					continue;
				}
				// check if this column is a USING column
				auto using_binding_ptr = GetUsingBinding(column_name, binding.alias);
				if (using_binding_ptr) {
					auto &using_binding = *using_binding_ptr;
					// it is!
					// check if we have already emitted the using column
					if (handled_using_columns.find(using_binding) != handled_using_columns.end()) {
						// we have! bail out
						continue;
					}
					// we have not! output the using column
					if (!using_binding.primary_binding.IsSet()) {
						// no primary binding: output a coalesce
						auto coalesce = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_COALESCE);
						for (auto &child_binding : using_binding.bindings) {
							coalesce->children.push_back(make_uniq<ColumnRefExpression>(column_name, child_binding));
						}
						coalesce->SetAlias(column_name);
						HandleRename(expr, qualified_column, *coalesce);
						new_select_list.push_back(std::move(coalesce));
					} else {
						// primary binding: output the qualified column ref
						auto new_expr = make_uniq<ColumnRefExpression>(column_name, using_binding.primary_binding);
						HandleRename(expr, qualified_column, *new_expr);
						new_select_list.push_back(std::move(new_expr));
					}
					handled_using_columns.insert(using_binding);
					continue;
				}
				auto new_expr =
				    CreateColumnReference(binding.alias, column_name, ColumnBindType::DO_NOT_EXPAND_GENERATED_COLUMNS);
				HandleRename(expr, qualified_column, *new_expr);
				new_select_list.push_back(std::move(new_expr));
			}
		}
	} else {
		// SELECT tbl.* case
		// SELECT struct.* case
		ErrorData error;
		auto binding = GetBinding(expr.relation_name, error);
		bool is_struct_ref = false;
		if (!binding) {
			binding = GetMatchingBinding(expr.relation_name);
			if (!binding) {
				error.Throw();
			}
			is_struct_ref = true;
		}

		if (is_struct_ref) {
			auto col_idx = binding->GetBindingIndex(expr.relation_name);
			auto col_type = binding->types[col_idx];
			if (col_type.id() != LogicalTypeId::STRUCT) {
				throw BinderException(StringUtil::Format(
				    "Cannot extract field from expression \"%s\" because it is not a struct", expr.ToString()));
			}
			auto &struct_children = StructType::GetChildTypes(col_type);
			vector<string> column_names(3);
			column_names[0] = binding->alias.GetAlias();
			column_names[1] = expr.relation_name;
			for (auto &child : struct_children) {
				QualifiedColumnName qualified_name(child.first);
				if (CheckExclusionList(expr, qualified_name, exclusion_info)) {
					continue;
				}
				column_names[2] = child.first;
				auto new_expr = make_uniq<ColumnRefExpression>(column_names);
				HandleRename(expr, qualified_name, *new_expr);
				new_select_list.push_back(std::move(new_expr));
			}
		} else {
			for (auto &column_name : binding->names) {
				QualifiedColumnName qualified_name(binding->alias, column_name);
				if (CheckExclusionList(expr, qualified_name, exclusion_info)) {
					continue;
				}
				auto new_expr =
				    CreateColumnReference(binding->alias, column_name, ColumnBindType::DO_NOT_EXPAND_GENERATED_COLUMNS);
				HandleRename(expr, qualified_name, *new_expr);
				new_select_list.push_back(std::move(new_expr));
			}
		}
	}

	if (binder.GetBindingMode() == BindingMode::EXTRACT_NAMES) {
		//! We only care about extracting the names of the referenced columns
		//! remove the exclude + replace lists
		expr.exclude_list.clear();
		expr.replace_list.clear();
	}

	//! Verify correctness of the exclude list
	for (auto &excluded : expr.exclude_list) {
		if (exclusion_info.excluded_qualified_columns.find(excluded) ==
		    exclusion_info.excluded_qualified_columns.end()) {
			throw BinderException("Column \"%s\" in EXCLUDE list not found in %s", excluded.ToString(),
			                      expr.relation_name.empty() ? "FROM clause" : expr.relation_name.c_str());
		}
	}

	//! Verify correctness of the replace list
	for (auto &entry : expr.replace_list) {
		if (exclusion_info.excluded_columns.find(entry.first) == exclusion_info.excluded_columns.end()) {
			throw BinderException("Column \"%s\" in REPLACE list not found in %s", entry.first,
			                      expr.relation_name.empty() ? "FROM clause" : expr.relation_name.c_str());
		}
	}
}